

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-death.c
# Opt level: O0

void death_examine(char *title,wchar_t row)

{
  _Bool _Var1;
  textblock *tb_00;
  region area;
  textblock *tb;
  char header [120];
  char *s;
  char *q;
  object *obj;
  char *pcStack_10;
  wchar_t row_local;
  char *title_local;
  
  header._112_8_ = anon_var_dwarf_e3e41;
  obj._4_4_ = row;
  pcStack_10 = title;
  while( true ) {
    _Var1 = get_item((object **)&q,"Examine which item? ",(char *)header._112_8_,CMD_NULL,
                     (item_tester)0x0,L'\x1b');
    if (!_Var1) break;
    tb_00 = object_info((object *)q,OINFO_NONE);
    object_desc((char *)&tb,0x78,(object *)q,0xc3,player);
    textui_textblock_show(tb_00,(region)ZEXT816(0),(char *)&tb);
    textblock_free(tb_00);
  }
  return;
}

Assistant:

static void death_examine(const char *title, int row)
{
	struct object *obj;
	const char *q, *s;

	/* Get an item */
	q = "Examine which item? ";
	s = "You have nothing to examine.";

	while (get_item(&obj, q, s, 0, NULL, (USE_INVEN | USE_QUIVER | USE_EQUIP | IS_HARMLESS))) {
		char header[120];

		textblock *tb;
		region area = { 0, 0, 0, 0 };

		tb = object_info(obj, OINFO_NONE);
		object_desc(header, sizeof(header), obj,
			ODESC_PREFIX | ODESC_FULL | ODESC_CAPITAL, player);

		textui_textblock_show(tb, area, header);
		textblock_free(tb);
	}
}